

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O1

void nn_cinproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_fsm *pnVar1;
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)&self[-3].item.prev;
  if (self == (nn_ins_item *)0x0) {
    self_00 = (nn_fsm *)0x0;
  }
  pnVar1 = (nn_fsm *)(ulong)*(uint *)&self_00[1].fn;
  if (*(uint *)&self_00[1].fn == 2) {
    pnVar1 = (nn_fsm *)&peer[-3].item.prev;
    if (peer == (nn_ins_item *)0x0) {
      pnVar1 = (nn_fsm *)0x0;
    }
    nn_sinproc_connect((nn_sinproc *)&self_00[1].stopped,pnVar1);
    nn_fsm_action(self_00,1);
    return;
  }
  nn_cinproc_connect_cold_1();
  if (pnVar1 != (nn_fsm *)0x0) {
    pnVar1 = (nn_fsm *)&pnVar1[-2].stopped.item;
  }
  nn_fsm_stop(pnVar1);
  return;
}

Assistant:

static void nn_cinproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_cinproc *cinproc;
    struct nn_binproc *binproc;

    cinproc = nn_cont (self, struct nn_cinproc, item);
    binproc = nn_cont (peer, struct nn_binproc, item);

    nn_assert_state (cinproc, NN_CINPROC_STATE_DISCONNECTED);
    nn_sinproc_connect (&cinproc->sinproc, &binproc->fsm);
    nn_fsm_action (&cinproc->fsm, NN_CINPROC_ACTION_CONNECT);
}